

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O0

void once_init(void)

{
  AsyncLogging *pAVar1;
  int in_stack_000000b4;
  string *in_stack_000000b8;
  AsyncLogging *in_stack_000000c0;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar2;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffd4;
  
  pAVar1 = (AsyncLogging *)operator_new(0x1f8);
  uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffd0);
  Logger::getLogFileName_abi_cxx11_();
  AsyncLogging::AsyncLogging(in_stack_000000c0,in_stack_000000b8,in_stack_000000b4);
  uVar3 = uVar2 & 0xffffff;
  AsyncLogger_ = pAVar1;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (CONCAT44(in_stack_ffffffffffffffd4,uVar2) & 0xffffffff00ffffff));
  AsyncLogging::start((AsyncLogging *)CONCAT44(in_stack_ffffffffffffffd4,uVar3));
  return;
}

Assistant:

void once_init(){
    AsyncLogger_ = new AsyncLogging(Logger::getLogFileName());
    AsyncLogger_->start();
}